

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QStringList * __thiscall QCommandLineParser::values(QCommandLineParser *this,QString *optionName)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  longlong *plVar4;
  ushort *puVar5;
  QString *in_RDX;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QCommandLineOption *option;
  QStringList *values;
  qsizetype optionOffset;
  const_iterator it;
  QCommandLineParserPrivate *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  const_iterator *in_stack_fffffffffffffef8;
  QMessageLogger *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  QMessageLogger local_a0;
  QMessageLogger local_68;
  longlong local_30;
  piter local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QCommandLineParserPrivate::checkParsed(in_stack_fffffffffffffee8,(char *)0x6f28e1);
  QHash<QString,_long_long>::constFind
            ((QHash<QString,_long_long> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             &in_stack_fffffffffffffee8->errorText);
  local_28 = (piter)QHash<QString,_long_long>::cend
                              ((QHash<QString,_long_long> *)in_stack_fffffffffffffef8);
  bVar2 = QHash<QString,_long_long>::const_iterator::operator!=
                    (in_stack_fffffffffffffef8,
                     (const_iterator *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                    );
  if (bVar2) {
    plVar4 = QHash<QString,_long_long>::const_iterator::operator*((const_iterator *)0x6f2974);
    local_30 = *plVar4;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QHash<long_long,_QList<QString>_>::value
              ((QHash<long_long,_QList<QString>_> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
               (longlong *)in_stack_ffffffffffffff00);
    bVar2 = QList<QString>::isEmpty((QList<QString> *)0x6f29cf);
    if (bVar2) {
      QList<QCommandLineOption>::at
                ((QList<QCommandLineOption> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (qsizetype)in_stack_fffffffffffffee8);
      QCommandLineOption::valueName((QCommandLineOption *)in_stack_fffffffffffffef8);
      bVar3 = QString::isEmpty((QString *)0x6f2a26);
      QString::~QString((QString *)0x6f2a37);
      if ((bVar3 & 1) != 0) {
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                   in_stack_fffffffffffffef4,(char *)in_stack_fffffffffffffee8);
        QtPrivate::asString(in_RDX);
        in_stack_fffffffffffffef8 =
             (const_iterator *)
             QString::utf16((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                           );
        QMessageLogger::warning
                  (&local_68,"QCommandLineParser: option not expecting values: \"%ls\"",
                   in_stack_fffffffffffffef8);
      }
      QCommandLineOption::defaultValues((QCommandLineOption *)in_stack_fffffffffffffef8);
      QList<QString>::operator=
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (QList<QString> *)in_stack_fffffffffffffee8);
      QList<QString>::~QList((QList<QString> *)0x6f2aec);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4
               ,(char *)in_stack_fffffffffffffee8);
    QtPrivate::asString(in_RDX);
    puVar5 = QString::utf16((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                           );
    QMessageLogger::warning(&local_a0,"QCommandLineParser: option not defined: \"%ls\"",puVar5);
    memset(in_RDI,0,0x18);
    QList<QString>::QList((QList<QString> *)0x6f2b5a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCommandLineParser::values(const QString &optionName) const
{
    d->checkParsed("values");
    auto it = d->nameHash.constFind(optionName);
    if (it != d->nameHash.cend()) {
        const qsizetype optionOffset = *it;
        QStringList values = d->optionValuesHash.value(optionOffset);
        if (values.isEmpty()) {
            const auto &option = d->commandLineOptionList.at(optionOffset);
            if (option.valueName().isEmpty()) {
                qWarning("QCommandLineParser: option not expecting values: \"%ls\"",
                         qUtf16Printable(optionName));
            }
            values = option.defaultValues();
        }
        return values;
    }

    qWarning("QCommandLineParser: option not defined: \"%ls\"", qUtf16Printable(optionName));
    return QStringList();
}